

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void group_tables(ecs_world_t *world,ecs_query_t *query)

{
  int32_t iVar1;
  void *pvVar2;
  ecs_matched_table_t *table_1;
  ecs_matched_table_t *table_array_1;
  int table_count_1;
  int table_i_1;
  ecs_matched_table_t *table;
  ecs_matched_table_t *table_array;
  int table_count;
  int table_i;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  if (query->group_table != (ecs_rank_type_action_t)0x0) {
    iVar1 = ecs_vector_count(query->tables);
    pvVar2 = _ecs_vector_first(query->tables,0x50,0x10);
    for (table_array._4_4_ = 0; table_array._4_4_ < iVar1; table_array._4_4_ = table_array._4_4_ + 1
        ) {
      group_table(world,query,(ecs_matched_table_t *)((long)pvVar2 + (long)table_array._4_4_ * 0x50)
                 );
    }
    iVar1 = ecs_vector_count(query->empty_tables);
    pvVar2 = _ecs_vector_first(query->empty_tables,0x50,0x10);
    for (table_array_1._4_4_ = 0; table_array_1._4_4_ < iVar1;
        table_array_1._4_4_ = table_array_1._4_4_ + 1) {
      group_table(world,query,
                  (ecs_matched_table_t *)((long)pvVar2 + (long)table_array_1._4_4_ * 0x50));
    }
  }
  return;
}

Assistant:

static
void group_tables(
    ecs_world_t *world,
    ecs_query_t *query)
{
    if (query->group_table) {
        ecs_vector_each(query->tables, ecs_matched_table_t, table, {
            group_table(world, query, table);
        });

        ecs_vector_each(query->empty_tables, ecs_matched_table_t, table, {
            group_table(world, query, table);
        });              
    }
}